

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenGlider.cpp
# Opt level: O2

bool __thiscall
OpenGliderConnection::AcListLookup
          (OpenGliderConnection *this,string *sDevId,FDKeyTy *key,FDStaticData *stat)

{
  ifstream *f;
  char cVar1;
  bool bVar2;
  unsigned_long key_00;
  int *piVar3;
  mapped_type *pmVar4;
  FDKeyType _eType;
  string *__return_storage_ptr__;
  string sFileName;
  char sErr [100];
  string local_70;
  string local_50;
  
  key_00 = std::__cxx11::stoul(sDevId,(size_t *)0x0,0x10);
  f = &this->ifAcList;
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::operator+(&sFileName,&dataRefs.LTPluginPath,"Resources/OGNAircraft.lst");
    std::ifstream::open((string *)f,(_Ios_Openmode)&sFileName);
    if (((&this->field_0x318)[*(long *)(*(long *)f + -0x18)] & 5) != 0) {
      piVar3 = __errno_location();
      strerror_r(*piVar3,sErr,100);
      if ((int)dataRefs.iLogLevel < 4) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTOpenGlider.cpp"
               ,0x3c6,"AcListLookup",logERR,"Could not open \'%s\' for reading: %s",
               sFileName._M_dataplus._M_p,sErr);
      }
    }
    std::__cxx11::string::~string((string *)&sFileName);
  }
  sErr[0] = '\0';
  sErr[1] = '\0';
  sErr[2] = '\0';
  sErr[3] = '\0';
  sErr[4] = '\0';
  sErr[5] = '\0';
  sErr[6] = '\0';
  sErr[7] = '\0';
  sErr[8] = ' ';
  sErr[9] = ' ';
  sErr[10] = ' ';
  sErr[0xb] = ' ';
  sErr[0xc] = ' ';
  sErr[0xd] = ' ';
  sErr[0xe] = ' ';
  sErr[0xf] = ' ';
  sErr[0x10] = ' ';
  sErr[0x11] = ' ';
  sErr[0x12] = ' ';
  sErr[0x13] = ' ';
  sErr[0x14] = ' ';
  sErr[0x15] = ' ';
  sErr[0x16] = ' ';
  sErr[0x17] = ' ';
  sErr[0x18] = ' ';
  sErr[0x19] = ' ';
  sErr[0x1a] = ' ';
  sErr[0x1b] = ' ';
  sErr[0x1c] = ' ';
  sErr[0x1d] = ' ';
  sErr[0x1e] = ' ';
  sErr[0x1f] = ' ';
  sErr[0x20] = ' ';
  sErr[0x21] = ' ';
  sErr[0x22] = ' ';
  sErr[0x23] = ' ';
  sErr[0x24] = ' ';
  sErr[0x25] = ' ';
  sErr[0x26] = ' ';
  sErr[0x27] = ' ';
  sErr[0x28] = ' ';
  sErr[0x29] = ' ';
  sErr[0x2a] = ' ';
  sErr[0x2b] = ' ';
  sErr[0x2c] = ' ';
  sErr[0x2d] = ' ';
  sErr[0x2e] = ' ';
  sErr[0x2f] = '\0';
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    bVar2 = FileRecLookup(f,&this->numRecAcList,key_00,&this->minKeyAcList,&this->maxKeyAcList,sErr,
                          0x30);
    if (bVar2) {
      if (sErr[9] != ' ') {
        std::__cxx11::string::assign((char *)&stat->mdl,(ulong)(sErr + 9));
        rtrim(&stat->mdl," \t\f\v\r\n");
      }
      if (sErr[0x23] != ' ') {
        std::__cxx11::string::assign((char *)stat,(ulong)(sErr + 0x23));
        rtrim(&stat->reg," \t\f\v\r\n");
      }
      if (sErr[0x2c] != ' ') {
        std::__cxx11::string::assign((char *)&stat->call,(ulong)(sErr + 0x2c));
        rtrim(&stat->call," \t\f\v\r\n");
      }
      if ((stat->mdl)._M_string_length != 0) {
        ModelIcaoType::getIcaoType(&stat->mdl);
        std::__cxx11::string::_M_assign((string *)&stat->acTypeIcao);
      }
      goto LAB_00172ed1;
    }
  }
  sErr[0] = '\0';
  sErr[1] = '\0';
  sErr[2] = '\0';
  sErr[3] = '\0';
  sErr[4] = '\0';
  sErr[5] = '\0';
  sErr[6] = '\0';
  sErr[7] = '\0';
  builtin_strncpy(sErr + 0x28,"       \x01",8);
  builtin_strncpy(sErr + 0x18,"                ",0x10);
  builtin_strncpy(sErr + 0x10,"        ",8);
  sErr[8] = 'O';
  sErr[9] = ' ';
  sErr[10] = ' ';
  sErr[0xb] = ' ';
  sErr[0xc] = ' ';
  sErr[0xd] = ' ';
  sErr[0xe] = ' ';
  sErr[0xf] = ' ';
LAB_00172ed1:
  cVar1 = sErr[0x2f];
  if ((sErr[0x2f] & 1U) != 0) {
    if ((sErr[0x2f] & 2U) == 0) {
      (stat->reg)._M_string_length = 0;
      *(stat->reg)._M_dataplus._M_p = '\0';
      (stat->call)._M_string_length = 0;
      *(stat->call)._M_dataplus._M_p = '\0';
      std::__cxx11::string::string((string *)&sFileName,(string *)sDevId);
      std::__cxx11::string::push_back((char)&sFileName);
      std::__cxx11::string::push_back((char)&sFileName);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OGNAnonymousIdMapTy,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OGNAnonymousIdMapTy>_>_>
               ::operator[](&this->mapAnonymousId,&sFileName);
      LTFlightData::FDKeyTy::SetKey_abi_cxx11_(&local_70,key,KEY_OGN,pmVar4->anonymId);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::_M_assign((string *)&stat->call);
      __return_storage_ptr__ = &sFileName;
    }
    else {
      _eType = (uint)(sErr[8] == 'I') * 3 + KEY_OGN;
      if (sErr[8] == 'F') {
        _eType = KEY_FLARM;
      }
      __return_storage_ptr__ = &local_50;
      LTFlightData::FDKeyTy::SetKey_abi_cxx11_(__return_storage_ptr__,key,_eType,key_00);
    }
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return (bool)(cVar1 & 1);
}

Assistant:

bool OpenGliderConnection::AcListLookup (const std::string& sDevId,
                                         LTFlightData::FDKeyTy& key,
                                         LTFlightData::FDStaticData& stat)
{
    // device id converted to binary number
    unsigned long uDevId = std::stoul(sDevId, nullptr, 16);
    
    // If needed open the file
    if (!ifAcList.is_open()) {
        // open the input file in binary mode
        const std::string sFileName = dataRefs.GetLTPluginPath() + OGN_AC_LIST_FILE;
        ifAcList.open (sFileName, std::ios::binary | std::ios::in);
        if (!ifAcList) {
            char sErr[SERR_LEN];
            strerror_s(sErr, sizeof(sErr), errno);
            LOG_MSG(logERR, ERR_OGN_ACL_FILE_OPEN_R, sFileName.c_str(), sErr);
        }
    }
    
    // look up data in the sorted file
    OGN_DDB_RecTy rec;
    if (ifAcList.is_open() &&
        FileRecLookup (ifAcList, numRecAcList,
                       uDevId, minKeyAcList, maxKeyAcList,
                       &rec, sizeof(rec)))
    {
        // copy some information into the stat structure
        if (*rec.mdl != ' ') { stat.mdl.assign(rec.mdl,sizeof(rec.mdl)); rtrim(stat.mdl); }
        if (*rec.reg != ' ') { stat.reg.assign(rec.reg,sizeof(rec.reg)); rtrim(stat.reg); }
        if (*rec.cn  != ' ') { stat.call.assign(rec.cn,sizeof(rec.cn));  rtrim(stat.call); }
        
        // based on the model information look up an ICAO a/c type
        if (!stat.mdl.empty())
            stat.acTypeIcao = ModelIcaoType::getIcaoType(stat.mdl);
    } else {
        // clear the record again (potentially used as buffer during lookup)
        // This will also CLEAR the TRACKED and IDENTIFIED flags
        // as required for a device not found in the DDB:
        rec = OGN_DDB_RecTy();
        rec.devType = 'O';          // treat it as an OGN id from the outset
        rec.SetTracked();           // tracking a not-in-DDB device is OK
    }
    
    // If the device doesn't want to be tracked we bail
    if (!rec.IsTracked())
        return false;
    
    // *** Aircraft key type / device
    
    // If the device doesn't want to be identified -> map to generated anonymous id
    if (!rec.IsIdentified()) {
        // clear any potentially identifying information
        stat.reg.clear();
        stat.call.clear();

        // The key into the map consists of the device id and the device type
        std::string idKey (sDevId);             // device id string
        idKey += '_';                           // _
        idKey += rec.devType;                   // append device type (F or I or even O) to increase uniqueness - just in case...
        // look up or _create_ the mapping record to the generated anonymous id
        OGNAnonymousIdMapTy& anon = mapAnonymousId[idKey];
        // take over the mapped anonymous id
        key.SetKey(LTFlightData::KEY_OGN, anon.anonymId);
        stat.call = anon.anonymCall;
    } else {
        // device is allowed to be identified
        key.SetKey(rec.devType == 'F' ? LTFlightData::KEY_FLARM    :
                   rec.devType == 'I' ? LTFlightData::KEY_ICAO     : LTFlightData::KEY_OGN,
                   uDevId);
    }
    
    // is allowed to be tracked, ie. is visible
    return true;
}